

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setFederateOperator
          (CommonCore *this,LocalFederateId federateID,
          shared_ptr<helics::FederateOperator> *callbacks)

{
  string_view message;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  FederateState *pFVar4;
  undefined8 uVar5;
  __shared_ptr *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  uint16_t index;
  ActionMessage fedOpUpdate;
  FederateState *fed;
  shared_ptr<helics::FederateOperator> *in_stack_fffffffffffffec8;
  ActionMessage *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined2 in_stack_fffffffffffffeee;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar6;
  undefined2 in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff0a;
  undefined4 in_stack_ffffffffffffff10;
  LocalFederateId in_stack_ffffffffffffff14;
  CommonCore *in_stack_ffffffffffffff48;
  
  if (setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)::
      nullFederate == '\0') {
    iVar3 = __cxa_guard_acquire(&setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)
                                 ::nullFederate);
    if (iVar3 != 0) {
      std::make_shared<helics::NullFederateOperator>();
      std::shared_ptr<helics::FederateOperator>::shared_ptr<helics::NullFederateOperator,void>
                ((shared_ptr<helics::FederateOperator> *)in_stack_fffffffffffffed0,
                 (shared_ptr<helics::NullFederateOperator> *)in_stack_fffffffffffffec8);
      std::shared_ptr<helics::NullFederateOperator>::~shared_ptr
                ((shared_ptr<helics::NullFederateOperator> *)0x49b87a);
      __cxa_atexit(std::shared_ptr<helics::FederateOperator>::~shared_ptr,
                   &setFederateOperator::nullFederate,&__dso_handle);
      __cxa_guard_release(&setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)
                           ::nullFederate);
    }
  }
  pFVar4 = getFederateAt((CommonCore *)CONCAT62(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08)
                         ,in_stack_ffffffffffffff14);
  if (pFVar4 == (FederateState *)0x0) {
    uVar5 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,(char *)in_RDX);
    message._M_len._4_2_ = in_stack_fffffffffffffeec;
    message._M_len._0_4_ = in_stack_fffffffffffffee8;
    message._M_len._6_2_ = in_stack_fffffffffffffeee;
    message._M_str._0_4_ = in_stack_fffffffffffffef0;
    message._M_str._4_4_ = in_stack_fffffffffffffef4;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_RDI,message);
    __cxa_throw(uVar5,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
  uVar6 = 0x240;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
  if (!bVar1) {
    std::shared_ptr<helics::FederateOperator>::operator=
              ((shared_ptr<helics::FederateOperator> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8);
  }
  uVar2 = getNextAirlockIndex(in_stack_ffffffffffffff48);
  std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::
  operator[]((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL> *
             )in_stack_fffffffffffffed0,(size_type)in_stack_fffffffffffffec8);
  gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
  load<std::shared_ptr<helics::FederateOperator>>
            ((AirLock<std::any,_std::mutex,_std::condition_variable> *)
             CONCAT44(uVar6,in_stack_fffffffffffffef0),
             (shared_ptr<helics::FederateOperator> *)
             CONCAT26(uVar2,CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)));
  std::atomic<helics::GlobalFederateId>::load(&pFVar4->global_id,seq_cst);
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
             CONCAT44(in_stack_ffffffffffffff14.fid,in_stack_ffffffffffffff10),
             (ActionMessage *)CONCAT62(in_stack_ffffffffffffff0a,uVar2));
  ActionMessage::~ActionMessage(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void CommonCore::setFederateOperator(LocalFederateId federateID,
                                     std::shared_ptr<FederateOperator> callbacks)
{
    static const std::shared_ptr<FederateOperator> nullFederate =
        std::make_shared<NullFederateOperator>();

    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is not valid (setFederateOperator)"));
    }

    ActionMessage fedOpUpdate(CMD_CORE_CONFIGURE);
    fedOpUpdate.messageID = UPDATE_FEDERATE_OPERATOR;
    if (!callbacks) {
        callbacks = nullFederate;
    }
    auto index = getNextAirlockIndex();
    dataAirlocks[index].load(std::move(callbacks));
    fedOpUpdate.counter = index;
    fedOpUpdate.source_id = fed->global_id.load();
    actionQueue.push(fedOpUpdate);
}